

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void llvm::APInt::tcShiftRight(WordType *Dst,uint Words,uint Count)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (Count == 0) {
    return;
  }
  uVar5 = Count >> 6;
  uVar1 = Words;
  if (uVar5 < Words) {
    uVar1 = uVar5;
  }
  uVar3 = Words - uVar1;
  if ((Count & 0x3f) == 0) {
    memmove(Dst,Dst + uVar1,(ulong)(uVar3 * 8));
  }
  else if (uVar5 < Words) {
    sVar2 = (sbyte)(Count & 0x3f);
    uVar4 = Dst[uVar1] >> sVar2;
    *Dst = uVar4;
    if (uVar3 != 1) {
      if (uVar5 < Words) {
        Words = uVar5;
      }
      uVar6 = 1;
      do {
        uVar5 = Words + (int)uVar6;
        Dst[uVar6 - 1] = Dst[uVar5] << (0x40U - sVar2 & 0x3f) | uVar4;
        uVar4 = Dst[uVar5] >> sVar2;
        Dst[uVar6] = uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  memset(Dst + uVar3,0,(ulong)(uVar1 << 3));
  return;
}

Assistant:

void APInt::tcShiftRight(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  unsigned WordsToMove = Words - WordShift;
  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst, Dst + WordShift, WordsToMove * APINT_WORD_SIZE);
  } else {
    for (unsigned i = 0; i != WordsToMove; ++i) {
      Dst[i] = Dst[i + WordShift] >> BitShift;
      if (i + 1 != WordsToMove)
        Dst[i] |= Dst[i + WordShift + 1] << (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst + WordsToMove, 0, WordShift * APINT_WORD_SIZE);
}